

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

AActor * P_SpawnPlayerMissile
                   (AActor *source,double x,double y,double z,PClassActor *type,DAngle *angle,
                   FTranslatedLineTarget *pLineTarget,AActor **pMissileActor,bool nofreeaim,
                   bool noautoaim,int aimflags)

{
  AWeapon *pAVar1;
  player_t *ppVar2;
  BYTE BVar3;
  bool bVar4;
  AActor *pAVar5;
  AActor *missile;
  undefined7 in_register_00000089;
  FTranslatedLineTarget *vrange;
  long lVar6;
  ulong uVar7;
  double dVar8;
  undefined8 uVar9;
  double local_b0;
  AActor *local_a8;
  undefined8 local_88;
  FTranslatedLineTarget local_80;
  DAngle local_68;
  DVector3 pos;
  FTranslatedLineTarget scratch;
  
  if ((int)CONCAT71(in_register_00000089,nofreeaim) == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0x4041800000000000;
  }
  if (source == (AActor *)0x0) {
    pAVar5 = (AActor *)0x0;
  }
  else {
    vrange = &scratch;
    if (pLineTarget != (FTranslatedLineTarget *)0x0) {
      vrange = pLineTarget;
    }
    if (((source->player == (player_t *)0x0) ||
        (pAVar1 = source->player->ReadyWeapon, pAVar1 == (AWeapon *)0x0)) ||
       (((pAVar1->super_AInventory).field_0x4dd & 0x40) == 0 && !noautoaim)) {
      dVar8 = *(double *)((type->super_PClass).Defaults + 0x2c0);
      uVar7 = -(ulong)(0.0 < dVar8);
      local_80.angleFromSource.Degrees =
           (double)(~uVar7 & 0x4090000000000000 | (ulong)(dVar8 * 64.0) & uVar7);
      local_80.unlinked = false;
      local_80._17_7_ = 0;
      lVar6 = 0x10;
      while( true ) {
        local_a8 = (AActor *)
                   (*(double *)((long)P_SpawnPlayerMissile::angdiff + lVar6) + angle->Degrees);
        local_88 = uVar9;
        local_80.linetarget = local_a8;
        P_AimLineAttack((AActor *)&pos,(DAngle *)source,local_80.angleFromSource.Degrees,&local_80,
                        (DAngle *)vrange,(int)&local_88,(AActor *)(ulong)(uint)aimflags,
                        (AActor *)0x0);
        local_b0 = pos.X;
        if (((source->player != (player_t *)0x0 && !nofreeaim) &&
            (bVar4 = FLevelLocals::IsFreelookAllowed(&level), bVar4)) &&
           (dVar8 = userinfo_t::GetAimDist(&source->player->userinfo), dVar8 <= 0.5)) break;
        pAVar5 = vrange->linetarget;
        if ((lVar6 == 0) || (lVar6 = lVar6 + -8, pAVar5 != (AActor *)0x0)) goto LAB_004c364f;
      }
      pAVar5 = vrange->linetarget;
LAB_004c364f:
      if ((pAVar5 == (AActor *)0x0) &&
         ((local_a8 = (AActor *)angle->Degrees, nofreeaim ||
          (bVar4 = FLevelLocals::IsFreelookAllowed(&level), !bVar4)))) {
        local_b0 = 0.0;
      }
    }
    else {
      local_a8 = (AActor *)angle->Degrees;
      local_b0 = (source->Angles).Pitch.Degrees;
      vrange->linetarget = (AActor *)0x0;
    }
    if (((z != -2147483648.0) || (NAN(z))) && ((z != 2147483647.0 || (NAN(z))))) {
      ppVar2 = source->player;
      if (ppVar2 == (player_t *)0x0) {
        dVar8 = 4.0;
      }
      else {
        dVar8 = (ppVar2->mo->AttackZOffset + -4.0) * ppVar2->crouchfactor;
      }
      z = ((source->Height * 0.5 + (source->__Pos).Z) - source->Floorclip) + z + dVar8;
      if (z < source->floorz) {
        z = source->floorz;
      }
    }
    AActor::Vec2OffsetZ(&pos,source,x,y,z,false);
    missile = Spawn(type,&pos,ALLOW_REPLACE);
    if (pMissileActor != (AActor **)0x0) {
      *pMissileActor = missile;
    }
    P_PlaySpawnSound(missile,source);
    (missile->target).field_0.p = source;
    (missile->Angles).Yaw.Degrees = (double)local_a8;
    if (((missile->flags3).Value & 3) == 0) {
      local_68.Degrees = local_b0;
      AActor::Vel3DFromAngle(missile,&local_68,missile->Speed);
    }
    else {
      AActor::VelFromAngle(missile);
    }
    if (((missile->flags4).Value & 0x40000) != 0) {
      if (source->player == (player_t *)0x0) {
        BVar3 = '\0';
      }
      else {
        BVar3 = (char)((long)(source->player[-0x3b4b].frags + 7) / 0x2a0) + '\x01';
      }
      missile->FriendPlayer = BVar3;
    }
    bVar4 = P_CheckMissileSpawn(missile,source->radius);
    pAVar5 = (AActor *)0x0;
    if (bVar4) {
      pAVar5 = missile;
    }
  }
  return pAVar5;
}

Assistant:

AActor *P_SpawnPlayerMissile (AActor *source, double x, double y, double z,
							  PClassActor *type, DAngle angle, FTranslatedLineTarget *pLineTarget, AActor **pMissileActor,
							  bool nofreeaim, bool noautoaim, int aimflags)
{
	static const double angdiff[3] = { -5.625, 5.625, 0 };
	DAngle an = angle;
	DAngle pitch;
	FTranslatedLineTarget scratch;
	AActor *defaultobject = GetDefaultByType(type);
	DAngle vrange = nofreeaim ? 35. : 0.;

	if (source == NULL)
	{
		return NULL;
	}
	if (!pLineTarget) pLineTarget = &scratch;
	if (source->player && source->player->ReadyWeapon && ((source->player->ReadyWeapon->WeaponFlags & WIF_NOAUTOAIM) || noautoaim))
	{
		// Keep exactly the same angle and pitch as the player's own aim
		an = angle;
		pitch = source->Angles.Pitch;
		pLineTarget->linetarget = NULL;
	}
	else // see which target is to be aimed at
	{
		// [XA] If MaxTargetRange is defined in the spawned projectile, use this as the
		//      maximum range for the P_AimLineAttack call later; this allows MaxTargetRange
		//      to function as a "maximum tracer-acquisition range" for seeker missiles.
		double linetargetrange = defaultobject->maxtargetrange > 0 ? defaultobject->maxtargetrange*64 : 16*64.;

		int i = 2;
		do
		{
			an = angle + angdiff[i];
			pitch = P_AimLineAttack (source, an, linetargetrange, pLineTarget, vrange, aimflags);
	
			if (source->player != NULL &&
				!nofreeaim &&
				level.IsFreelookAllowed() &&
				source->player->userinfo.GetAimDist() <= 0.5)
			{
				break;
			}
		} while (pLineTarget->linetarget == NULL && --i >= 0);

		if (pLineTarget->linetarget == NULL)
		{
			an = angle;
			if (nofreeaim || !level.IsFreelookAllowed())
			{
				pitch = 0.;
			}
		}
	}

	if (z != ONFLOORZ && z != ONCEILINGZ)
	{
		// Doom spawns missiles 4 units lower than hitscan attacks for players.
		z += source->Center() - source->Floorclip;
		if (source->player != NULL)	// Considering this is for player missiles, it better not be NULL.
		{
			z += ((source->player->mo->AttackZOffset - 4) * source->player->crouchfactor);
		}
		else
		{
			z += 4;
		}
		// Do not fire beneath the floor.
		if (z < source->floorz)
		{
			z = source->floorz;
		}
	}
	DVector3 pos = source->Vec2OffsetZ(x, y, z);
	AActor *MissileActor = Spawn (type, pos, ALLOW_REPLACE);
	if (pMissileActor) *pMissileActor = MissileActor;
	P_PlaySpawnSound(MissileActor, source);
	MissileActor->target = source;
	MissileActor->Angles.Yaw = an;
	if (MissileActor->flags3 & (MF3_FLOORHUGGER | MF3_CEILINGHUGGER))
	{
		MissileActor->VelFromAngle();
	}
	else
	{
		MissileActor->Vel3DFromAngle(pitch, MissileActor->Speed);
	}

	if (MissileActor->flags4 & MF4_SPECTRAL)
	{
		MissileActor->SetFriendPlayer(source->player);
	}
	if (P_CheckMissileSpawn (MissileActor, source->radius))
	{
		return MissileActor;
	}
	return NULL;
}